

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_randomize_mxz(mbedtls_ecp_group *grp,mbedtls_ecp_point *P,
                     _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t sVar1;
  int iVar2;
  int local_5c;
  int count;
  size_t p_size;
  mbedtls_mpi l;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_ecp_point *P_local;
  mbedtls_ecp_group *grp_local;
  
  sVar1 = grp->pbits;
  local_5c = 0;
  mbedtls_mpi_init((mbedtls_mpi *)&p_size);
  do {
    mbedtls_mpi_fill_random((mbedtls_mpi *)&p_size,sVar1 + 7 >> 3,f_rng,p_rng);
    while (iVar2 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&p_size,&grp->P), -1 < iVar2) {
      l.p._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&p_size,1);
      if (l.p._4_4_ != 0) goto LAB_00143509;
      l.p._4_4_ = 0;
    }
    if (10 < local_5c) {
      return -0x4d00;
    }
    iVar2 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&p_size,1);
    local_5c = local_5c + 1;
  } while (iVar2 < 1);
  l.p._4_4_ = mbedtls_mpi_mul_mpi(&P->X,&P->X,(mbedtls_mpi *)&p_size);
  if ((l.p._4_4_ == 0) && (l.p._4_4_ = ecp_modp(&P->X,grp), l.p._4_4_ == 0)) {
    mul_count = mul_count + 1;
    l.p._4_4_ = mbedtls_mpi_mul_mpi(&P->Z,&P->Z,(mbedtls_mpi *)&p_size);
    if ((l.p._4_4_ == 0) && (l.p._4_4_ = ecp_modp(&P->Z,grp), l.p._4_4_ == 0)) {
      mul_count = mul_count + 1;
    }
  }
LAB_00143509:
  mbedtls_mpi_free((mbedtls_mpi *)&p_size);
  return l.p._4_4_;
}

Assistant:

static int ecp_randomize_mxz( const mbedtls_ecp_group *grp, mbedtls_ecp_point *P,
                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret;
    mbedtls_mpi l;
    size_t p_size = ( grp->pbits + 7 ) / 8;
    int count = 0;

    mbedtls_mpi_init( &l );

    /* Generate l such that 1 < l < p */
    do
    {
        mbedtls_mpi_fill_random( &l, p_size, f_rng, p_rng );

        while( mbedtls_mpi_cmp_mpi( &l, &grp->P ) >= 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &l, 1 ) );

        if( count++ > 10 )
            return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
    }
    while( mbedtls_mpi_cmp_int( &l, 1 ) <= 0 );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &P->X, &P->X, &l ) ); MOD_MUL( P->X );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &P->Z, &P->Z, &l ) ); MOD_MUL( P->Z );

cleanup:
    mbedtls_mpi_free( &l );

    return( ret );
}